

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void SendTimestepEntryToSingleReader
               (SstStream Stream,CPTimestepList Entry,WS_ReaderInfo CP_WSR_Stream,int rank)

{
  undefined4 uVar1;
  undefined4 uVar2;
  SstPreloadModeType SVar3;
  _SentTimestepRec *p_Var4;
  CP_DP_PerReaderTimestepRegFunc p_Var5;
  undefined8 in_RAX;
  size_t count;
  size_t sVar6;
  _SentTimestepRec *p_Var7;
  long lVar8;
  ssize_t sVar9;
  _SentTimestepRec **pp_Var10;
  SstPreloadModeType SVar11;
  _SentTimestepRec *p_Var12;
  FFSFormatList tmp;
  FFSFormatList *ppFVar13;
  FFSFormatList pFVar14;
  bool bVar15;
  undefined8 uVar16;
  
  count._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  if (CP_WSR_Stream->ReaderStatus == Established) {
    sVar6 = CP_WSR_Stream->FormatSentCount;
    sVar9 = Entry->Timestep;
    CP_WSR_Stream->LastSentTimestep = sVar9;
    ppFVar13 = &Stream->PreviousFormats;
    while( true ) {
      pFVar14 = *ppFVar13;
      bVar15 = sVar6 == 0;
      sVar6 = sVar6 - 1;
      if ((pFVar14 == (FFSFormatList)0x0) || (bVar15)) break;
      ppFVar13 = &pFVar14->Next;
    }
    Entry->Msg->Formats = pFVar14;
    if (rank != -1) {
      CP_verbose(Stream,PerRankVerbose,"Sent timestep %zd to reader cohort %d\n",sVar9,
                 (ulong)(uint)rank);
      sVar9 = Entry->Timestep;
    }
    uVar1 = Entry->MetaDataSendCount;
    uVar2 = Entry->ReferenceCount;
    Entry->MetaDataSendCount = uVar1 + 1;
    Entry->ReferenceCount = uVar2 + 1;
    uVar16 = CONCAT44(count._4_4_,uVar2 + 1);
    CP_verbose(Stream,PerRankVerbose,
               "ADDING timestep %zd to sent list for reader cohort %d, READER %p, reference count is now %d\n"
               ,sVar9,(ulong)(uint)rank,CP_WSR_Stream,uVar16);
    lVar8 = Entry->Timestep;
    p_Var7 = (_SentTimestepRec *)malloc(0x10);
    p_Var4 = CP_WSR_Stream->SentTimestepList;
    p_Var7->Timestep = lVar8;
    p_Var7->Next = (_SentTimestepRec *)0x0;
    if (p_Var4 == (_SentTimestepRec *)0x0) {
      pp_Var10 = &CP_WSR_Stream->SentTimestepList;
    }
    else {
      do {
        p_Var12 = p_Var4;
        p_Var4 = p_Var12->Next;
      } while (p_Var4 != (_SentTimestepRec *)0x0);
      pp_Var10 = &p_Var12->Next;
    }
    *pp_Var10 = p_Var7;
    SVar11 = SstPreloadNone;
    if ((CP_WSR_Stream->PreloadModeActiveTimestep <= lVar8) &&
       (SVar3 = CP_WSR_Stream->PreloadMode, SVar11 = SstPreloadNone, SVar3 != SstPreloadNone)) {
      CP_verbose(Stream,PerStepVerbose,
                 "PRELOADMODE for timestep %zd non-default for reader , active at timestep %zd, mode %d\n"
                 ,lVar8,CP_WSR_Stream->PreloadModeActiveTimestep,(ulong)SVar3,uVar16);
      SVar11 = SVar3;
    }
    Entry->Msg->PreloadMode = SVar11;
    lVar8 = 0;
    for (; pFVar14 != (FFSFormatList)0x0; pFVar14 = pFVar14->Next) {
      lVar8 = lVar8 + 1;
    }
    CP_WSR_Stream->FormatSentCount = CP_WSR_Stream->FormatSentCount + lVar8;
    pthread_mutex_unlock((pthread_mutex_t *)&Stream->DataLock);
    p_Var5 = Stream->DP_Interface->readerRegisterTimestep;
    if (p_Var5 != (CP_DP_PerReaderTimestepRegFunc)0x0) {
      (*p_Var5)(&Svcs,CP_WSR_Stream->DP_WSR_Stream,Entry->Timestep,SVar11);
    }
    pthread_mutex_lock((pthread_mutex_t *)&Stream->DataLock);
    if (CP_WSR_Stream->ReaderStatus == Established) {
      sendOneToWSRCohort(CP_WSR_Stream,Stream->CPInfo->SharedCM->DeliverTimestepMetadataFormat,
                         Entry->Msg,&Entry->Msg->RS_Stream);
      return;
    }
  }
  return;
}

Assistant:

static void SendTimestepEntryToSingleReader(SstStream Stream, CPTimestepList Entry,
                                            WS_ReaderInfo CP_WSR_Stream, int rank)
{
    STREAM_ASSERT_LOCKED(Stream);
    if (CP_WSR_Stream->ReaderStatus == Established)
    {
        size_t PriorSent = CP_WSR_Stream->FormatSentCount;
        CP_WSR_Stream->LastSentTimestep = Entry->Timestep;
        FFSFormatList ToSend = ReturnNthListEntry(Stream->PreviousFormats, PriorSent);
        Entry->Msg->Formats = ToSend;

        if (rank != -1)
        {
            CP_verbose(Stream, PerRankVerbose, "Sent timestep %zd to reader cohort %d\n",
                       Entry->Timestep, rank);
        }
        Entry->ReferenceCount++;
        Entry->MetaDataSendCount++;
        CP_verbose(Stream, PerRankVerbose,
                   "ADDING timestep %zd to sent list for reader cohort %d, "
                   "READER %p, reference count is now %d\n",
                   Entry->Timestep, rank, CP_WSR_Stream, Entry->ReferenceCount);
        AddTSToSentList(Stream, CP_WSR_Stream, Entry->Timestep);
        SstPreloadModeType PMode = SstPreloadNone;

        if ((Entry->Timestep >= CP_WSR_Stream->PreloadModeActiveTimestep) &&
            (CP_WSR_Stream->PreloadMode != SstPreloadNone))
        {
            PMode = CP_WSR_Stream->PreloadMode;
            CP_verbose(Stream, PerStepVerbose,
                       "PRELOADMODE for timestep %zd non-default for reader , "
                       "active at timestep %zd, mode %d\n",
                       Entry->Timestep, CP_WSR_Stream->PreloadModeActiveTimestep, PMode);
        }
        Entry->Msg->PreloadMode = PMode;
        CP_WSR_Stream->FormatSentCount += FormatListCount(ToSend);
        STREAM_MUTEX_UNLOCK(Stream);
        if (Stream->DP_Interface->readerRegisterTimestep)
        {
            (Stream->DP_Interface->readerRegisterTimestep)(&Svcs, CP_WSR_Stream->DP_WSR_Stream,
                                                           Entry->Timestep, PMode);
        }

        STREAM_MUTEX_LOCK(Stream);
        if (CP_WSR_Stream->ReaderStatus == Established)
            sendOneToWSRCohort(CP_WSR_Stream,
                               Stream->CPInfo->SharedCM->DeliverTimestepMetadataFormat, Entry->Msg,
                               &Entry->Msg->RS_Stream);
    }
}